

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::StripAllButComments::fodder(StripAllButComments *this,Fodder *fodder)

{
  bool bVar1;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_RDI;
  FodderElement *f;
  iterator __end2;
  iterator __begin2;
  Fodder *__range2;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffff68;
  pointer *in_stack_ffffffffffffff70;
  value_type *in_stack_ffffffffffffff78;
  Kind *in_stack_ffffffffffffff88;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffff90;
  value_type local_68;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  reference local_30;
  FodderElement *local_28;
  __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (FodderElement *)
       std::
       vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
       begin(in_stack_ffffffffffffff68);
  local_28 = (FodderElement *)
             std::
             vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             ::end(in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                             *)in_stack_ffffffffffffff68), bVar1) {
    local_30 = __gnu_cxx::
               __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
               ::operator*(local_20);
    if (local_30->kind == PARAGRAPH) {
      local_34 = 2;
      local_38 = 0;
      local_3c = 0;
      std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>
      ::
      emplace_back<jsonnet::internal::FodderElement::Kind,int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(int *)in_RDI,
                 (int *)in_stack_ffffffffffffff78,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff70);
    }
    else if (local_30->kind == INTERSTITIAL) {
      in_stack_ffffffffffffff70 =
           &in_RDI[1].
            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      push_back(in_RDI,in_stack_ffffffffffffff78);
      local_40 = 0;
      local_68.comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      local_68.comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_68.kind = LINE_END;
      local_68.blanks = 0;
      local_68.indent = 0;
      local_68._12_4_ = 0;
      local_68.comment.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      in_stack_ffffffffffffff78 = &local_68;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x2c4d6a);
      std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>
      ::
      emplace_back<jsonnet::internal::FodderElement::Kind,int,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(int *)in_RDI,
                 (int *)in_stack_ffffffffffffff78,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
    ::operator++(local_20);
  }
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  clear((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         *)0x2c4dd0);
  return;
}

Assistant:

void fodder(Fodder &fodder)
    {
        for (auto &f : fodder) {
            if (f.kind == FodderElement::PARAGRAPH) {
                comments.emplace_back(FodderElement::PARAGRAPH, 0, 0, f.comment);
            } else if (f.kind == FodderElement::INTERSTITIAL) {
                comments.push_back(f);
                comments.emplace_back(FodderElement::LINE_END, 0, 0, std::vector<std::string>{});
            }
        }
        fodder.clear();
    }